

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileUtilityTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator
          (cmMakefileUtilityTargetGenerator *this,cmGeneratorTarget *target)

{
  cmOSXBundleGenerator *pcVar1;
  cmOSXBundleGenerator *this_00;
  
  cmMakefileTargetGenerator::cmMakefileTargetGenerator
            (&this->super_cmMakefileTargetGenerator,target);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileUtilityTargetGenerator_00be68e8;
  (this->super_cmMakefileTargetGenerator).CustomCommandDriver = OnUtility;
  this_00 = (cmOSXBundleGenerator *)operator_new(0x20);
  cmOSXBundleGenerator::cmOSXBundleGenerator(this_00,target);
  pcVar1 = (this->super_cmMakefileTargetGenerator).OSXBundleGenerator._M_t.
           super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>.
           _M_t.
           super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>
           .super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl;
  (this->super_cmMakefileTargetGenerator).OSXBundleGenerator._M_t.
  super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>.
  super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl = this_00;
  if (pcVar1 != (cmOSXBundleGenerator *)0x0) {
    operator_delete(pcVar1,0x20);
  }
  ((this->super_cmMakefileTargetGenerator).OSXBundleGenerator._M_t.
   super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>._M_t.
   super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>.
   super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl)->MacContentFolders =
       &(this->super_cmMakefileTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmMakefileUtilityTargetGenerator::cmMakefileUtilityTargetGenerator(
  cmGeneratorTarget* target)
  : cmMakefileTargetGenerator(target)
{
  this->CustomCommandDriver = OnUtility;
  this->OSXBundleGenerator = cm::make_unique<cmOSXBundleGenerator>(target);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}